

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WavLog.cpp
# Opt level: O3

void WavParserHelper::PrintFactChunk(FactChunk rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char cVar3;
  size_t sVar4;
  long *plVar5;
  size_type *psVar6;
  ulong uVar7;
  char cVar8;
  ulong in_stack_0000000c;
  ulong in_stack_00000014;
  string __str;
  string Data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  uint local_68;
  long local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  sVar4 = strlen(&stack0x00000008);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,&stack0x00000008,&stack0x00000008 + sVar4);
  std::__cxx11::string::resize((ulong)&local_50,'\x04');
  std::operator+(&local_90,"ChunkID: ",&local_50);
  PrintLog(&local_90,(ostream *)&std::cout);
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  cVar8 = '\x01';
  if (9 < in_stack_0000000c) {
    uVar7 = in_stack_0000000c;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_0010516d;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_0010516d;
      }
      if (uVar7 < 10000) goto LAB_0010516d;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_0010516d:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,in_stack_0000000c);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10a101);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  PrintLog(&local_90,(ostream *)&std::cout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  cVar8 = '\x01';
  if (9 < in_stack_00000014) {
    uVar7 = in_stack_00000014;
    cVar3 = '\x04';
    do {
      cVar8 = cVar3;
      if (uVar7 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_00105290;
      }
      if (uVar7 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_00105290;
      }
      if (uVar7 < 10000) goto LAB_00105290;
      bVar2 = 99999 < uVar7;
      uVar7 = uVar7 / 10000;
      cVar3 = cVar8 + '\x04';
    } while (bVar2);
    cVar8 = cVar8 + '\x01';
  }
LAB_00105290:
  local_70 = local_60;
  std::__cxx11::string::_M_construct((ulong)&local_70,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,in_stack_00000014);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x10a1a8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar6;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  PrintLog(&local_90,(ostream *)&std::cout);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void WavParserHelper::PrintFactChunk(FactChunk rhs)
{
	//if not restrict size, there problem on \0 with char convert to string
	std::string Data(rhs.ckID);
	Data.resize(4);

	PrintLog("ChunkID: " + Data);
	PrintLog("ChunkSize: " + std::to_string(rhs.ckSize));
	PrintLog("SampleLength: " + std::to_string(rhs.dwSampleLength));

	std::cout << std::endl;
}